

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_knot.cpp
# Opt level: O3

knot_style ON_KnotVectorStyle(int order,int cv_count,double *knot)

{
  double dVar1;
  long lVar2;
  long lVar3;
  knot_style kVar4;
  ulong uVar5;
  long lVar6;
  double dVar7;
  
  kVar4 = unknown_knot_style;
  if ((1 < order) && (knot != (double *)0x0 && order <= cv_count)) {
    dVar1 = knot[(ulong)(uint)order - 2];
    if (dVar1 < knot[cv_count - 1U]) {
      uVar5 = (ulong)(order - 1);
      dVar7 = ((knot[cv_count - 1U] - knot[(ulong)(uint)cv_count - 2]) + (knot[uVar5] - dVar1)) *
              0.5;
      if ((((knot[(ulong)(uint)cv_count - 1] != knot[(ulong)(uint)(cv_count + order) - 3]) ||
           (NAN(knot[(ulong)(uint)cv_count - 1]) || NAN(knot[(ulong)(uint)(cv_count + order) - 3])))
          || (*knot != dVar1)) || (NAN(*knot) || NAN(dVar1))) {
        uVar5 = 1;
        do {
          if (dVar7 * 1e-06 < ABS((knot[uVar5] - knot[uVar5 - 1]) - dVar7)) {
            return non_uniform_knots;
          }
          uVar5 = uVar5 + 1;
        } while ((cv_count + order) - 2 != uVar5);
        return uniform_knots;
      }
      if (order == cv_count) {
        return piecewise_bezier_knots;
      }
      lVar6 = 0;
      kVar4 = quasi_uniform_knots;
      do {
        if (dVar7 * 1e-06 < ABS((knot[uVar5 + lVar6] - knot[uVar5 + lVar6 + -1]) - dVar7)) {
          lVar6 = 0;
          while( true ) {
            if ((long)(int)(cv_count - 1U) <= (long)(uVar5 + lVar6)) {
              return piecewise_bezier_knots;
            }
            lVar2 = uVar5 + lVar6;
            lVar3 = lVar6 + -1;
            if (knot[lVar2] != knot[uVar5 * 2 + lVar3]) break;
            lVar6 = uVar5 + lVar6;
            if (NAN(knot[lVar2]) || NAN(knot[uVar5 * 2 + lVar3])) {
              return clamped_end_knots;
            }
          }
          return clamped_end_knots;
        }
        lVar6 = lVar6 + 1;
      } while ((cv_count - order) + 1 != (int)lVar6);
    }
  }
  return kVar4;
}

Assistant:

ON::knot_style ON_KnotVectorStyle( 
       int order,
       int cv_count,
       const double* knot
       )
{
  ON::knot_style s = ON::unknown_knot_style;
  if ( order >= 2 && cv_count >= order && knot && knot[order-2] < knot[cv_count-1] ) {
    const int knot_count = order+cv_count-2;
    const double delta = 0.5*((knot[order-1] - knot[order-2]) + (knot[cv_count-1] - knot[cv_count-2]));
    const double ktol = delta*1.0e-6;
    int i;
    if ( ON_IsKnotVectorClamped( order, cv_count, knot ) ) {
      if ( order == cv_count ) {
        s = ON::piecewise_bezier_knots;
      }
      else {
        s = ON::clamped_end_knots;
        for ( i = order-1; i <= cv_count-1; i++ ) {
          if ( fabs(knot[i] - knot[i-1] - delta) > ktol ) {
            break;
          }
        }
        if ( i >= cv_count ) {
          s = ON::quasi_uniform_knots;
        }
        else {
          const int degree = order-1;
          for ( i = order-1; i < cv_count-1; i += degree ) {
            if ( knot[i] != knot[i+degree-1] )
              break; 
          }
          if ( i >= cv_count-1 )
            s = ON::piecewise_bezier_knots;
        }
      }
    }
    else {
      // check for uniform knots
      s = ON::non_uniform_knots;
      for ( i = 1; i < knot_count; i++ ) {
        if ( fabs(knot[i] - knot[i-1] - delta) > ktol ) {
          break;
        }
      }
      if ( i >= knot_count )
        s = ON::uniform_knots; 
    }
  }
  return s;
}